

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall
pybind11::str::str<pybind11::detail::accessor_policies::str_attr>
          (str *this,accessor<pybind11::detail::accessor_policies::str_attr> *a)

{
  object oStack_18;
  
  detail::accessor::operator_cast_to_object((accessor *)&oStack_18);
  str(this,&oStack_18);
  object::~object(&oStack_18);
  return;
}

Assistant:

str(const char *c, const SzType &n)
        : object(PyUnicode_FromStringAndSize(c, ssize_t_cast(n)), stolen_t{}) {
        if (!m_ptr) {
            if (PyErr_Occurred()) {
                throw error_already_set();
            }
            pybind11_fail("Could not allocate string object!");
        }
    }